

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst-timerfd.c
# Opt level: O1

void dotest(int clockid)

{
  int iVar1;
  int *piVar2;
  ssize_t sVar3;
  long lVar4;
  long lVar5;
  timespec tVar6;
  timespec tVar7;
  int fd;
  uint64_t counter;
  pollfd pfd;
  itimerspec tout;
  itimerspec t8;
  pthread_t th2;
  itimerspec t4;
  itimerspec t9;
  itimerspec t7;
  itimerspec t6;
  itimerspec t5;
  itimerspec t46;
  itimerspec t45;
  itimerspec t3;
  itimerspec t2;
  itimerspec t1;
  char buf [1024];
  timespec tStack_5e8;
  int local_5cc;
  ulong local_5c8;
  pollfd local_5c0;
  itimerspec local_5b8;
  itimerspec local_598;
  pthread_t local_570;
  itimerspec local_568;
  itimerspec local_548;
  itimerspec local_528;
  itimerspec local_508;
  itimerspec local_4e8;
  itimerspec local_4c8;
  itimerspec local_4a8;
  itimerspec local_488;
  itimerspec local_468;
  itimerspec local_448;
  undefined1 local_428 [1032];
  
  tStack_5e8.tv_nsec = 0x102b4b;
  piVar2 = __errno_location();
  *piVar2 = 0;
  tStack_5e8.tv_nsec = 0x102b60;
  local_5cc = timerfd_create(clockid,0x800);
  if (local_5cc < 0) {
    tStack_5e8.tv_nsec = 0x103599;
    dotest_cold_107();
LAB_00103599:
    tStack_5e8.tv_nsec = 0x10359e;
    dotest_cold_1();
LAB_0010359e:
    tStack_5e8.tv_nsec = 0x1035a3;
    dotest_cold_2();
LAB_001035a3:
    tStack_5e8.tv_nsec = 0x1035a8;
    dotest_cold_3();
LAB_001035a8:
    tStack_5e8.tv_nsec = 0x1035ad;
    dotest_cold_4();
LAB_001035ad:
    tStack_5e8.tv_nsec = 0x1035b2;
    dotest_cold_5();
LAB_001035b2:
    tStack_5e8.tv_nsec = 0x1035b7;
    dotest_cold_6();
LAB_001035b7:
    tStack_5e8.tv_nsec = 0x1035bc;
    dotest_cold_106();
LAB_001035bc:
    tStack_5e8.tv_nsec = 0x1035c1;
    dotest_cold_7();
LAB_001035c1:
    tStack_5e8.tv_nsec = 0x1035c6;
    dotest_cold_8();
LAB_001035c6:
    tStack_5e8.tv_nsec = 0x1035cb;
    dotest_cold_9();
LAB_001035cb:
    tStack_5e8.tv_nsec = 0x1035d0;
    dotest_cold_10();
LAB_001035d0:
    tStack_5e8.tv_nsec = 0x1035d5;
    dotest_cold_11();
LAB_001035d5:
    tStack_5e8.tv_nsec = 0x1035da;
    dotest_cold_12();
LAB_001035da:
    tStack_5e8.tv_nsec = 0x1035df;
    dotest_cold_13();
LAB_001035df:
    tStack_5e8.tv_nsec = 0x1035e4;
    dotest_cold_105();
LAB_001035e4:
    tStack_5e8.tv_nsec = 0x1035e9;
    dotest_cold_14();
LAB_001035e9:
    tStack_5e8.tv_nsec = 0x1035ee;
    dotest_cold_15();
LAB_001035ee:
    tStack_5e8.tv_nsec = 0x1035f3;
    dotest_cold_16();
LAB_001035f3:
    tStack_5e8.tv_nsec = 0x1035f8;
    dotest_cold_17();
LAB_001035f8:
    tStack_5e8.tv_nsec = 0x1035fd;
    dotest_cold_18();
LAB_001035fd:
    tStack_5e8.tv_nsec = 0x103602;
    dotest_cold_19();
LAB_00103602:
    tStack_5e8.tv_nsec = 0x103607;
    dotest_cold_20();
LAB_00103607:
    tStack_5e8.tv_nsec = 0x10360c;
    dotest_cold_21();
LAB_0010360c:
    tStack_5e8.tv_nsec = 0x103611;
    dotest_cold_22();
LAB_00103611:
    tStack_5e8.tv_nsec = 0x103616;
    dotest_cold_23();
LAB_00103616:
    tStack_5e8.tv_nsec = 0x10361b;
    dotest_cold_104();
LAB_0010361b:
    tStack_5e8.tv_nsec = 0x103620;
    dotest_cold_24();
LAB_00103620:
    tStack_5e8.tv_nsec = 0x103625;
    dotest_cold_25();
LAB_00103625:
    tStack_5e8.tv_nsec = 0x10362a;
    dotest_cold_26();
LAB_0010362a:
    tStack_5e8.tv_nsec = 0x10362f;
    dotest_cold_27();
LAB_0010362f:
    tStack_5e8.tv_nsec = 0x103634;
    dotest_cold_103();
LAB_00103634:
    tStack_5e8.tv_nsec = 0x103639;
    dotest_cold_28();
LAB_00103639:
    tStack_5e8.tv_nsec = 0x10363e;
    dotest_cold_29();
LAB_0010363e:
    tStack_5e8.tv_nsec = 0x103643;
    dotest_cold_30();
LAB_00103643:
    tStack_5e8.tv_nsec = 0x103648;
    dotest_cold_102();
LAB_00103648:
    tStack_5e8.tv_nsec = 0x10364d;
    dotest_cold_31();
LAB_0010364d:
    tStack_5e8.tv_nsec = 0x103652;
    dotest_cold_32();
LAB_00103652:
    tStack_5e8.tv_nsec = 0x103657;
    dotest_cold_33();
LAB_00103657:
    tStack_5e8.tv_nsec = 0x10365c;
    dotest_cold_34();
LAB_0010365c:
    tStack_5e8.tv_nsec = 0x103661;
    dotest_cold_35();
LAB_00103661:
    tStack_5e8.tv_nsec = 0x103666;
    dotest_cold_36();
LAB_00103666:
    tStack_5e8.tv_nsec = 0x10366b;
    dotest_cold_37();
LAB_0010366b:
    tStack_5e8.tv_nsec = 0x103670;
    dotest_cold_101();
LAB_00103670:
    tStack_5e8.tv_nsec = 0x103675;
    dotest_cold_38();
LAB_00103675:
    tStack_5e8.tv_nsec = 0x10367a;
    dotest_cold_39();
LAB_0010367a:
    tStack_5e8.tv_nsec = 0x10367f;
    dotest_cold_40();
LAB_0010367f:
    tStack_5e8.tv_nsec = 0x103684;
    dotest_cold_41();
LAB_00103684:
    tStack_5e8.tv_nsec = 0x103689;
    dotest_cold_100();
LAB_00103689:
    tStack_5e8.tv_nsec = 0x10368e;
    dotest_cold_99();
LAB_0010368e:
    tStack_5e8.tv_nsec = 0x103693;
    dotest_cold_42();
LAB_00103693:
    tStack_5e8.tv_nsec = 0x103698;
    dotest_cold_98();
LAB_00103698:
    tStack_5e8.tv_nsec = 0x10369d;
    dotest_cold_43();
LAB_0010369d:
    tStack_5e8.tv_nsec = 0x1036a2;
    dotest_cold_97();
LAB_001036a2:
    tStack_5e8.tv_nsec = 0x1036a7;
    dotest_cold_44();
LAB_001036a7:
    tStack_5e8.tv_nsec = 0x1036ac;
    dotest_cold_45();
LAB_001036ac:
    tStack_5e8.tv_nsec = 0x1036b1;
    dotest_cold_96();
LAB_001036b1:
    tStack_5e8.tv_nsec = 0x1036b6;
    dotest_cold_46();
LAB_001036b6:
    tStack_5e8.tv_nsec = 0x1036bb;
    dotest_cold_95();
LAB_001036bb:
    tStack_5e8.tv_nsec = 0x1036c0;
    dotest_cold_47();
LAB_001036c0:
    tStack_5e8.tv_nsec = 0x1036c5;
    dotest_cold_94();
LAB_001036c5:
    tStack_5e8.tv_nsec = 0x1036ca;
    dotest_cold_48();
LAB_001036ca:
    tStack_5e8.tv_nsec = 0x1036cf;
    dotest_cold_49();
LAB_001036cf:
    tStack_5e8.tv_nsec = 0x1036d4;
    dotest_cold_50();
LAB_001036d4:
    tStack_5e8.tv_nsec = 0x1036d9;
    dotest_cold_93();
LAB_001036d9:
    tStack_5e8.tv_nsec = 0x1036de;
    dotest_cold_51();
LAB_001036de:
    tStack_5e8.tv_nsec = 0x1036e3;
    dotest_cold_92();
LAB_001036e3:
    tStack_5e8.tv_nsec = 0x1036e8;
    dotest_cold_52();
LAB_001036e8:
    tStack_5e8.tv_nsec = 0x1036ed;
    dotest_cold_53();
LAB_001036ed:
    tStack_5e8.tv_nsec = 0x1036f2;
    dotest_cold_91();
LAB_001036f2:
    tStack_5e8.tv_nsec = 0x1036f7;
    dotest_cold_54();
LAB_001036f7:
    tStack_5e8.tv_nsec = 0x1036fc;
    dotest_cold_55();
LAB_001036fc:
    tStack_5e8.tv_nsec = 0x103701;
    dotest_cold_56();
LAB_00103701:
    tStack_5e8.tv_nsec = 0x103706;
    dotest_cold_57();
LAB_00103706:
    tStack_5e8.tv_nsec = 0x10370b;
    dotest_cold_58();
LAB_0010370b:
    tStack_5e8.tv_nsec = 0x103710;
    dotest_cold_90();
LAB_00103710:
    tStack_5e8.tv_nsec = 0x103715;
    dotest_cold_89();
LAB_00103715:
    tStack_5e8.tv_nsec = 0x10371a;
    dotest_cold_59();
LAB_0010371a:
    tStack_5e8.tv_nsec = 0x10371f;
    dotest_cold_88();
LAB_0010371f:
    tStack_5e8.tv_nsec = 0x103724;
    dotest_cold_60();
LAB_00103724:
    tStack_5e8.tv_nsec = 0x103729;
    dotest_cold_61();
LAB_00103729:
    tStack_5e8.tv_nsec = 0x10372e;
    dotest_cold_62();
LAB_0010372e:
    tStack_5e8.tv_nsec = 0x103733;
    dotest_cold_63();
LAB_00103733:
    tStack_5e8.tv_nsec = 0x103738;
    dotest_cold_87();
LAB_00103738:
    tStack_5e8.tv_nsec = 0x10373d;
    dotest_cold_86();
LAB_0010373d:
    tStack_5e8.tv_nsec = 0x103742;
    dotest_cold_85();
LAB_00103742:
    tStack_5e8.tv_nsec = 0x103747;
    dotest_cold_64();
LAB_00103747:
    tStack_5e8.tv_nsec = 0x10374c;
    dotest_cold_65();
LAB_0010374c:
    tStack_5e8.tv_nsec = 0x103751;
    dotest_cold_66();
LAB_00103751:
    tStack_5e8.tv_nsec = 0x103756;
    dotest_cold_67();
LAB_00103756:
    tStack_5e8.tv_nsec = 0x10375b;
    dotest_cold_84();
LAB_0010375b:
    tStack_5e8.tv_nsec = 0x103760;
    dotest_cold_83();
LAB_00103760:
    tStack_5e8.tv_nsec = 0x103765;
    dotest_cold_82();
LAB_00103765:
    tStack_5e8.tv_nsec = 0x10376a;
    dotest_cold_68();
LAB_0010376a:
    tStack_5e8.tv_nsec = 0x10376f;
    dotest_cold_69();
LAB_0010376f:
    tStack_5e8.tv_nsec = 0x103774;
    dotest_cold_70();
LAB_00103774:
    tStack_5e8.tv_nsec = 0x103779;
    dotest_cold_71();
LAB_00103779:
    tStack_5e8.tv_nsec = 0x10377e;
    dotest_cold_81();
LAB_0010377e:
    tStack_5e8.tv_nsec = 0x103783;
    dotest_cold_80();
LAB_00103783:
    tStack_5e8.tv_nsec = 0x103788;
    dotest_cold_79();
LAB_00103788:
    tStack_5e8.tv_nsec = 0x10378d;
    dotest_cold_72();
LAB_0010378d:
    tStack_5e8.tv_nsec = 0x103792;
    dotest_cold_78();
LAB_00103792:
    tStack_5e8.tv_nsec = 0x103797;
    dotest_cold_73();
LAB_00103797:
    tStack_5e8.tv_nsec = 0x10379c;
    dotest_cold_74();
LAB_0010379c:
    tStack_5e8.tv_nsec = 0x1037a1;
    dotest_cold_75();
  }
  else {
    if (*piVar2 != 0) goto LAB_00103599;
    local_5c0.events = 1;
    local_5c0.revents = 0;
    tStack_5e8.tv_nsec = 0x102b8f;
    local_5c0.fd = local_5cc;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_0010359e;
    tStack_5e8.tv_nsec = 0x102bad;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_001035a3;
    if (*piVar2 != 0xb) goto LAB_001035a8;
    tStack_5e8.tv_nsec = 0x102bd6;
    sVar3 = read(local_5cc,local_428,7);
    if (sVar3 != -1) goto LAB_001035ad;
    if (*piVar2 != 0x16) goto LAB_001035b2;
    local_448.it_value.tv_sec = 0;
    local_448.it_value.tv_nsec = 500000000;
    local_448.it_interval.tv_sec = 0;
    local_448.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102c19;
    iVar1 = timerfd_settime(local_5cc,0,&local_448,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001035b7;
    if (*piVar2 != 0) goto LAB_001035bc;
    tStack_5e8.tv_nsec = 0x102c40;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_001035c1;
    if (*piVar2 != 0xb) goto LAB_001035c6;
    tStack_5e8.tv_nsec = 0x102c5d;
    sleep(1);
    tStack_5e8.tv_nsec = 0x102c70;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001035cb;
    if (local_5c8 != 1) goto LAB_001035d0;
    tStack_5e8.tv_nsec = 0x102c99;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != -1) goto LAB_001035d5;
    if (*piVar2 != 0xb) goto LAB_001035da;
    local_468.it_value.tv_sec = 0;
    local_468.it_value.tv_nsec = 300000000;
    local_468.it_interval.tv_sec = 0;
    local_468.it_interval.tv_nsec = 200000000;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102cdc;
    iVar1 = timerfd_settime(local_5cc,0,&local_468,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001035df;
    if (*piVar2 != 0) goto LAB_001035e4;
    tStack_5e8.tv_nsec = 0x102d03;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_001035e9;
    if (*piVar2 != 0xb) goto LAB_001035ee;
    tStack_5e8.tv_nsec = 0x102d20;
    iVar1 = usleep(400000);
    if (iVar1 != 0) goto LAB_001035f3;
    tStack_5e8.tv_nsec = 0x102d39;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 1) goto LAB_001035f8;
    if (local_5c0.revents != 1) goto LAB_001035fd;
    tStack_5e8.tv_nsec = 0x102d58;
    iVar1 = usleep(400000);
    if (iVar1 != 0) goto LAB_00103602;
    tStack_5e8.tv_nsec = 0x102d71;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 1) goto LAB_00103607;
    if (local_5c0.revents != 1) goto LAB_0010360c;
    tStack_5e8.tv_nsec = 0x102d99;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_00103611;
    if (local_5c8 < 3) goto LAB_00103616;
    if (local_5c8 != 3) goto LAB_0010361b;
    tStack_5e8.tv_nsec = 0x102dcf;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != -1) goto LAB_00103620;
    if (*piVar2 != 0xb) goto LAB_00103625;
    tStack_5e8.tv_nsec = 0x102dec;
    usleep(400000);
    tStack_5e8.tv_nsec = 0x102dfd;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 1) goto LAB_0010362a;
    local_488.it_value.tv_sec = 0;
    local_488.it_value.tv_nsec = 0;
    local_488.it_interval.tv_sec = 0;
    local_488.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102e2b;
    iVar1 = timerfd_settime(local_5cc,0,&local_488,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_0010362f;
    if (*piVar2 != 0) goto LAB_00103634;
    tStack_5e8.tv_nsec = 0x102e4d;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_00103639;
    tStack_5e8.tv_nsec = 0x102e5f;
    usleep(400000);
    tStack_5e8.tv_nsec = 0x102e70;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_0010363e;
    local_568.it_value.tv_sec = 0;
    local_568.it_value.tv_nsec = 0;
    local_568.it_interval.tv_sec = 0;
    local_568.it_interval.tv_nsec = 0;
    tStack_5e8.tv_nsec = 0x102e96;
    clock_gettime(clockid,&local_568.it_value);
    lVar4 = local_568.it_value.tv_nsec + 300000000;
    if (699999999 < local_568.it_value.tv_nsec) {
      local_568.it_value.tv_sec = local_568.it_value.tv_sec + 1;
      lVar4 = local_568.it_value.tv_nsec + -700000000;
    }
    local_568.it_value.tv_nsec = lVar4;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102ede;
    iVar1 = timerfd_settime(local_5cc,1,&local_568,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103643;
    if (*piVar2 != 0) goto LAB_00103648;
    tStack_5e8.tv_nsec = 0x102f05;
    sVar3 = read(local_5cc,local_428,0x400);
    if (sVar3 != -1) goto LAB_0010364d;
    if (*piVar2 != 0xb) goto LAB_00103652;
    tStack_5e8.tv_nsec = 0x102f22;
    usleep(500000);
    tStack_5e8.tv_nsec = 0x102f35;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_00103657;
    if (local_5c8 != 1) goto LAB_0010365c;
    tStack_5e8.tv_nsec = 0x102f5e;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != -1) goto LAB_00103661;
    if (*piVar2 != 0xb) goto LAB_00103666;
    local_4a8.it_value.tv_sec = 0;
    local_4a8.it_value.tv_nsec = 400000000;
    local_4a8.it_interval.tv_sec = 0;
    local_4a8.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x102fa1;
    iVar1 = timerfd_settime(local_5cc,0,&local_4a8,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_0010366b;
    if (*piVar2 != 0) goto LAB_00103670;
    tStack_5e8.tv_nsec = 0x102fb7;
    tVar6 = steady_clock_now();
    tStack_5e8.tv_nsec = 0x102fce;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_00103675;
    tStack_5e8.tv_nsec = 0x102fea;
    iVar1 = poll(&local_5c0,1,100);
    if (iVar1 != 0) goto LAB_0010367a;
    tStack_5e8.tv_nsec = 0x103006;
    iVar1 = poll(&local_5c0,1,1000);
    if (iVar1 != 1) goto LAB_0010367f;
    tStack_5e8.tv_nsec = 0x103014;
    tVar7 = steady_clock_now();
    lVar5 = tVar7.tv_nsec - tVar6.tv_nsec;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (((lVar5 >> 0x3f) + (tVar7.tv_sec - tVar6.tv_sec)) * 1000000000 + lVar4 < 300000000)
    goto LAB_00103684;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103054;
    iVar1 = close(local_5cc);
    if (iVar1 < 0) goto LAB_00103689;
    if (*piVar2 != 0) goto LAB_0010368e;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103074;
    local_5cc = timerfd_create(0,0);
    if (local_5cc < 0) goto LAB_00103693;
    if (*piVar2 != 0) goto LAB_00103698;
    local_4c8.it_value.tv_sec = 10;
    local_4c8.it_value.tv_nsec = 0;
    local_4c8.it_interval.tv_sec = 0;
    local_4c8.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x1030bd;
    local_5c0.fd = local_5cc;
    iVar1 = timerfd_settime(local_5cc,0,&local_4c8,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_0010369d;
    if (*piVar2 != 0) goto LAB_001036a2;
    tStack_5e8.tv_nsec = 0x1030df;
    iVar1 = poll(&local_5c0,1,0);
    if (iVar1 != 0) goto LAB_001036a7;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x1030f6;
    iVar1 = close(local_5cc);
    if (iVar1 < 0) goto LAB_001036ac;
    if (*piVar2 != 0) goto LAB_001036b1;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103116;
    local_5cc = timerfd_create(0,0);
    if (local_5cc < 0) goto LAB_001036b6;
    if (*piVar2 != 0) goto LAB_001036bb;
    local_4e8.it_value.tv_sec = 0;
    local_4e8.it_value.tv_nsec = 500000000;
    local_4e8.it_interval.tv_sec = 0;
    local_4e8.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x10315f;
    local_5c0.fd = local_5cc;
    iVar1 = timerfd_settime(local_5cc,0,&local_4e8,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001036c0;
    if (*piVar2 != 0) goto LAB_001036c5;
    tStack_5e8.tv_nsec = 0x103175;
    tVar6 = steady_clock_now();
    tStack_5e8.tv_nsec = 0x10318e;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001036ca;
    if (local_5c8 != 1) goto LAB_001036cf;
    tStack_5e8.tv_nsec = 0x1031a9;
    tVar7 = steady_clock_now();
    lVar5 = tVar7.tv_nsec - tVar6.tv_nsec;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (((lVar5 >> 0x3f) + (tVar7.tv_sec - tVar6.tv_sec)) * 1000000000 + lVar4 < 400000000)
    goto LAB_001036d4;
    tStack_5e8.tv_nsec = 0x1031f2;
    iVar1 = pthread_create(&local_570,(pthread_attr_t *)0x0,th2_func,&local_5cc);
    if (iVar1 != 0) goto LAB_001036d9;
    tStack_5e8.tv_nsec = 0x103204;
    usleep(400000);
    local_508.it_value.tv_sec = 0;
    local_508.it_value.tv_nsec = 200000000;
    local_508.it_interval.tv_sec = 0;
    local_508.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103234;
    iVar1 = timerfd_settime(local_5cc,0,&local_508,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001036de;
    if (*piVar2 != 0) goto LAB_001036e3;
    tStack_5e8.tv_nsec = 0x103251;
    iVar1 = pthread_join(local_570,(void **)0x0);
    if (iVar1 != 0) goto LAB_001036e8;
    local_528.it_value.tv_sec = 0;
    local_528.it_value.tv_nsec = 500000000;
    local_528.it_interval.tv_sec = 0;
    local_528.it_interval.tv_nsec = 200000000;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103289;
    iVar1 = timerfd_settime(local_5cc,0,&local_528,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_001036ed;
    if (*piVar2 != 0) goto LAB_001036f2;
    tStack_5e8.tv_nsec = 0x10329f;
    tVar6 = steady_clock_now();
    tStack_5e8.tv_nsec = 0x1032b8;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_001036f7;
    if (local_5c8 != 1) goto LAB_001036fc;
    tStack_5e8.tv_nsec = 0x1032e1;
    sVar3 = read(local_5cc,&local_5c8,8);
    if (sVar3 != 8) goto LAB_00103701;
    if (local_5c8 != 1) goto LAB_00103706;
    tStack_5e8.tv_nsec = 0x1032fc;
    tVar7 = steady_clock_now();
    lVar5 = tVar7.tv_nsec - tVar6.tv_nsec;
    lVar4 = lVar5 + 1000000000;
    if (-1 < lVar5) {
      lVar4 = lVar5;
    }
    if (((lVar5 >> 0x3f) + (tVar7.tv_sec - tVar6.tv_sec)) * 1000000000 + lVar4 < 600000000)
    goto LAB_0010370b;
    local_598.it_value.tv_sec = 0;
    local_598.it_value.tv_nsec = 300000000;
    local_598.it_interval.tv_sec = 0;
    local_598.it_interval.tv_nsec = 400000000;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x10335a;
    iVar1 = timerfd_settime(local_5cc,0,&local_598,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103710;
    if (*piVar2 != 0) goto LAB_00103715;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x10337f;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_0010371a;
    if (*piVar2 != 0) goto LAB_0010371f;
    if (local_5b8.it_interval.tv_sec != local_598.it_interval.tv_sec) goto LAB_00103724;
    if (local_5b8.it_interval.tv_nsec != local_598.it_interval.tv_nsec) goto LAB_00103729;
    if (local_5b8.it_value.tv_sec != local_598.it_value.tv_sec) goto LAB_0010372e;
    if (local_598.it_value.tv_nsec < local_5b8.it_value.tv_nsec) goto LAB_00103733;
    if (local_5b8.it_value.tv_nsec < local_598.it_value.tv_nsec + -100000000) goto LAB_00103738;
    tStack_5e8.tv_nsec = 0x1033ec;
    usleep(100000);
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103400;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_0010373d;
    if (*piVar2 != 0) goto LAB_00103742;
    if (local_5b8.it_interval.tv_sec != local_598.it_interval.tv_sec) goto LAB_00103747;
    if (local_5b8.it_interval.tv_nsec != local_598.it_interval.tv_nsec) goto LAB_0010374c;
    if (local_5b8.it_value.tv_sec != local_598.it_value.tv_sec) goto LAB_00103751;
    if (local_598.it_value.tv_nsec + -100000000 < local_5b8.it_value.tv_nsec) goto LAB_00103756;
    if (local_5b8.it_value.tv_nsec < local_598.it_value.tv_nsec + -200000000) goto LAB_0010375b;
    tStack_5e8.tv_nsec = 0x103474;
    usleep(300000);
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103488;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_00103760;
    if (*piVar2 != 0) goto LAB_00103765;
    if (local_5b8.it_interval.tv_sec != local_598.it_interval.tv_sec) goto LAB_0010376a;
    if (local_5b8.it_interval.tv_nsec != local_598.it_interval.tv_nsec) goto LAB_0010376f;
    if (local_5b8.it_value.tv_sec != local_598.it_value.tv_sec) goto LAB_00103774;
    if (local_5b8.it_value.tv_nsec < 200000000) goto LAB_00103779;
    if (400000000 < local_5b8.it_value.tv_nsec) goto LAB_0010377e;
    local_548.it_value.tv_sec = 0;
    local_548.it_value.tv_nsec = 100000000;
    local_548.it_interval.tv_sec = 0;
    local_548.it_interval.tv_nsec = 0;
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103516;
    iVar1 = timerfd_settime(local_5cc,0,&local_548,(itimerspec *)0x0);
    if (iVar1 < 0) goto LAB_00103783;
    if (*piVar2 != 0) goto LAB_00103788;
    tStack_5e8.tv_nsec = 0x103531;
    usleep(200000);
    *piVar2 = 0;
    tStack_5e8.tv_nsec = 0x103545;
    iVar1 = timerfd_gettime(local_5cc,&local_5b8);
    if (iVar1 < 0) goto LAB_0010378d;
    if (*piVar2 != 0) goto LAB_00103792;
    if (local_5b8.it_interval.tv_sec != 0) goto LAB_00103797;
    if (local_5b8.it_interval.tv_nsec != 0) goto LAB_0010379c;
    if (local_5b8.it_value.tv_sec == 0) {
      if (local_5b8.it_value.tv_nsec == 0) {
        return;
      }
      goto LAB_001037a6;
    }
  }
  tStack_5e8.tv_nsec = 0x1037a6;
  dotest_cold_76();
LAB_001037a6:
  tStack_5e8.tv_nsec = (long)steady_clock_now;
  dotest_cold_77();
  iVar1 = clock_gettime(1,&tStack_5e8);
  if (-1 < iVar1) {
    return;
  }
  abort();
}

Assistant:

static void
dotest(int clockid)
{
	int fd;
	expect_success(fd, timerfd_create(clockid, TFD_NONBLOCK));
	int junk;

	// Before we set a timer, timerfd has no events for polling or reading
	struct pollfd pfd = { .fd = fd, .events = POLLIN };
	expect(poll(&pfd, 1, 0), 0);
	char buf[1024];
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// Reading less than 8 bytes result in an error
	expect_errno(read(fd, buf, 7), EINVAL);

	// Set a timer to expire in 500ms from now (relative time)
	struct itimerspec t1 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t1, NULL));
	// If we check now, the timer should have not yet expired
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	// But if we sleep for a whole second, the timer would have expired and
	// read returns a counter of 1
	sleep(1);
	u64 counter;
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Similarly, set a timer to expire in 300ms, and then again every
	// 200ms. After 400ms, poll sees the timer expired at least once, but
	// we do not read. After 400ms more, we read and see the timer expired
	// 3 times.
	struct itimerspec t2 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t2, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(usleep(400000), 0);
#ifdef ALLOW_TIMER_SLACK
	expect(poll(&pfd, 1, -1), 1);
#else
	expect(poll(&pfd, 1, 0), 1);
#endif
	expect((int)pfd.revents, POLLIN);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expectge(counter, (u64)3);
#ifndef ALLOW_TIMER_SLACK
	expect(counter, (u64)3);
#endif
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// If sleep (so counter becomes nonzero again) and then cancel the
	// timer, the counter remains zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 1); // counter is nonzero
	struct itimerspec t3 = { { 0, 0 }, { 0, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t3, NULL));
	expect(poll(&pfd, 1, 0), 0); // counter is back to zero
	usleep(400000);
	expect(poll(&pfd, 1, 0), 0); // and timer was really canceled

	// Check absolute time setting
	// Set a timer to expire in 300ms from now (using absolute time)
	struct itimerspec t4 = { { 0, 0 }, { 0, 0 } };
	clock_gettime(clockid, &(t4.it_value));
	t4.it_value.tv_nsec += MS_TO_NSEC(300);
	if (t4.it_value.tv_nsec >= MS_TO_NSEC(1000)) {
		t4.it_value.tv_nsec -= MS_TO_NSEC(1000);
		t4.it_value.tv_sec++;
	}
	expect_success(junk, timerfd_settime(fd, TFD_TIMER_ABSTIME, &t4, NULL));
	expect_errno(read(fd, buf, sizeof(buf)), EAGAIN);
	usleep(500000);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect_errno(read(fd, &counter, sizeof(counter)), EAGAIN);

	// Check blocking poll - simple case, no interval (see more complex
	// cases in blocking read tests below).
	struct itimerspec t45 = { { 0, 0 }, { 0, MS_TO_NSEC(400) } };
	expect_success(junk, timerfd_settime(fd, 0, &t45, NULL));
	struct timespec before = steady_clock_now();
	expect(poll(&pfd, 1, 0), 0);
	expect(poll(&pfd, 1, 100 /*ms*/), 0);
	expect(poll(&pfd, 1, 1000 /*ms*/), 1);
	struct timespec after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(300));

	// Check close
	expect_success(junk, close(fd));

	// Check that it's not a disaster to close an fd with a yet-unexpired
	// timer
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;
	struct itimerspec t46 = { { 0, 0 }, { 10, 0 } };
	expect_success(junk, timerfd_settime(fd, 0, &t46, NULL));
	expect(poll(&pfd, 1, 0), 0);
	expect_success(junk, close(fd));

	// Open again with blocking read enabled
	expect_success(fd, timerfd_create(CLOCK_REALTIME, 0));
	pfd.fd = fd;

	// Check blocking read, no interval, timer set before read blocks
	struct itimerspec t5 = { { 0, 0 }, { 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t5, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(400));

	// Check blocking read, no interval, timer set after read blocks
	pthread_t th2;
	expect(pthread_create(&th2, NULL, th2_func, &fd), 0);
	usleep(400000);
	struct itimerspec t6 = { { 0, 0 }, { 0, MS_TO_NSEC(200) } };
	expect_success(junk, timerfd_settime(fd, 0, &t6, NULL));
	expect(pthread_join(th2, NULL), 0);

	// Check blocking read, with interval
	struct itimerspec t7 = { { 0, MS_TO_NSEC(200) },
		{ 0, MS_TO_NSEC(500) } };
	expect_success(junk, timerfd_settime(fd, 0, &t7, NULL));
	before = steady_clock_now();
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	expect(read(fd, &counter, sizeof(counter)), (ssize_t)8);
	expect(counter, (u64)1);
	after = steady_clock_now();
	expectge(nano_diff(after, before), (int64_t)MS_TO_NSEC(600));

	// Check timerfd_gettime():
	struct itimerspec t8 = { { 0, MS_TO_NSEC(400) },
		{ 0, MS_TO_NSEC(300) } };
	expect_success(junk, timerfd_settime(fd, 0, &t8, NULL));
	struct itimerspec tout;
	// Right in the beginning:
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec, tout.it_value.tv_nsec);
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(100));
	// After a while but before expiration:
	usleep(100000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
	expectge(t8.it_value.tv_nsec - (long)MS_TO_NSEC(100),
	    tout.it_value.tv_nsec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec,
	    t8.it_value.tv_nsec - (long)MS_TO_NSEC(200));
#endif
	// After expiration, we have the interval
	usleep(300000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, t8.it_interval.tv_sec);
	expect(tout.it_interval.tv_nsec, t8.it_interval.tv_nsec);
	expect(tout.it_value.tv_sec, t8.it_value.tv_sec);
#ifndef ALLOW_TIMER_SLACK
	expectge(tout.it_value.tv_nsec, (long)MS_TO_NSEC(200));
	expectge((long)MS_TO_NSEC(400), tout.it_value.tv_nsec);
#endif

	// Check timerfd_gettime() after expiration of a single-time timer:
	struct itimerspec t9 = { { 0, 0 }, { 0, MS_TO_NSEC(100) } };
	expect_success(junk, timerfd_settime(fd, 0, &t9, NULL));
	usleep(200000);
	expect_success(junk, timerfd_gettime(fd, &tout));
	expect(tout.it_interval.tv_sec, (long)0);
	expect(tout.it_interval.tv_nsec, (long)0);
	expect(tout.it_value.tv_sec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
	expect(tout.it_value.tv_nsec, (long)0);
}